

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_packed_uint.h
# Opt level: O2

packed_uint<4U> * __thiscall crnlib::packed_uint<4U>::operator=(packed_uint<4U> *this,uint val)

{
  uint i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this[lVar1] = SUB41(val >> 0x18,0);
    val = val << 8;
  }
  return this;
}

Assistant:

inline packed_uint& operator=(unsigned int val) {
#ifdef CRNLIB_BUILD_DEBUG
    if (N == 1) {
      CRNLIB_ASSERT(val <= 0xFFU);
    } else if (N == 2) {
      CRNLIB_ASSERT(val <= 0xFFFFU);
    } else if (N == 3) {
      CRNLIB_ASSERT(val <= 0xFFFFFFU);
    }
#endif

    val <<= (8U * (4U - N));

    for (unsigned int i = 0; i < N; i++) {
      m_buf[i] = static_cast<unsigned char>(val >> 24U);
      val <<= 8U;
    }

    return *this;
  }